

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O2

void Eigen::internal::
     assign_LinearTraversal_CompleteUnrolling<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_0,_3>
     ::run(Matrix<double,_3,_1,_0,_3,_1> *dst,
          CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *src)

{
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
       (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] -
       (((src->m_rhs).m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
       m_storage.m_data.array[0] * (src->m_rhs).m_functor.m_other;
  assign_LinearTraversal_CompleteUnrolling<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_1,_3>
  ::run(dst,src);
  return;
}

Assistant:

const _LhsNested& lhs() const { return m_lhs; }